

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_DNS(RTPUDPv6Transmitter *this)

{
  size_t *psVar1;
  sockaddr *psVar2;
  _List_node_base *p_Var3;
  addrinfo *paVar4;
  int iVar5;
  _List_node_base *p_Var6;
  addrinfo *res;
  addrinfo hints;
  char name [1024];
  addrinfo *local_460;
  addrinfo local_458;
  char local_428 [1023];
  undefined1 local_29;
  
  gethostname(local_428,0x3ff);
  local_29 = 0;
  local_458.ai_flags = 0;
  local_458.ai_addrlen = 0;
  local_458._20_4_ = 0;
  local_458.ai_addr = (sockaddr *)0x0;
  local_458.ai_canonname = (char *)0x0;
  local_458.ai_next = (addrinfo *)0x0;
  local_458.ai_family = 10;
  local_458.ai_socktype = 0;
  local_458.ai_protocol = 0;
  iVar5 = getaddrinfo(local_428,(char *)0x0,&local_458,&local_460);
  paVar4 = local_460;
  if (iVar5 == 0) {
    for (; paVar4 != (addrinfo *)0x0; paVar4 = paVar4->ai_next) {
      if (paVar4->ai_family == 10) {
        psVar2 = paVar4->ai_addr;
        p_Var6 = (_List_node_base *)operator_new(0x20);
        p_Var3 = *(_List_node_base **)(psVar2 + 1);
        p_Var6[1]._M_next = *(_List_node_base **)(psVar2->sa_data + 6);
        p_Var6[1]._M_prev = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
    }
    freeaddrinfo(local_460);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::GetLocalIPList_DNS()
{
	int status;
	char name[1024];

	gethostname(name,1023);
	name[1023] = 0;

	struct addrinfo hints;
	struct addrinfo *res,*tmp;
	
	memset(&hints,0,sizeof(struct addrinfo));
	hints.ai_family = AF_INET6;
	hints.ai_socktype = 0;
	hints.ai_protocol = 0;

	if ((status = getaddrinfo(name,0,&hints,&res)) != 0)
		return;

	tmp = res;
	while (tmp != 0)
	{
		if (tmp->ai_family == AF_INET6)
		{
			struct sockaddr_in6 *addr = (struct sockaddr_in6 *)(tmp->ai_addr);
			localIPs.push_back(addr->sin6_addr);
		}
		tmp = tmp->ai_next;
	}
	
	freeaddrinfo(res);	
}